

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gcpio_compat.c
# Opt level: O0

void test_gcpio_compat(void)

{
  wchar_t wVar1;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                  ,L'A',L'\0');
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    unpack_test("test_gcpio_compat_ref_nosym.bin","--no-preserve-owner","1 block\n");
    unpack_test("test_gcpio_compat_ref_nosym.crc","--no-preserve-owner","2 blocks\n");
    unpack_test("test_gcpio_compat_ref_nosym.newc","--no-preserve-owner","2 blocks\n");
    unpack_test("test_gcpio_compat_ref_nosym.ustar","--no-preserve-owner","7 blocks\n");
  }
  else {
    unpack_test("test_gcpio_compat_ref.bin","--no-preserve-owner","1 block\n");
    unpack_test("test_gcpio_compat_ref.crc","--no-preserve-owner","2 blocks\n");
    unpack_test("test_gcpio_compat_ref.newc","--no-preserve-owner","2 blocks\n");
    unpack_test("test_gcpio_compat_ref.ustar","--no-preserve-owner","7 blocks\n");
  }
  return;
}

Assistant:

DEFINE_TEST(test_gcpio_compat)
{
	assertUmask(0);

	/* Dearchive sample files with a variety of options. */
	if (canSymlink()) {
		unpack_test("test_gcpio_compat_ref.bin",
		    "--no-preserve-owner", "1 block\n");
		unpack_test("test_gcpio_compat_ref.crc",
		    "--no-preserve-owner", "2 blocks\n");
		unpack_test("test_gcpio_compat_ref.newc",
		    "--no-preserve-owner", "2 blocks\n");
		/* gcpio-2.9 only reads 6 blocks here */
		unpack_test("test_gcpio_compat_ref.ustar",
		    "--no-preserve-owner", "7 blocks\n");
	} else {
		unpack_test("test_gcpio_compat_ref_nosym.bin",
		    "--no-preserve-owner", "1 block\n");
		unpack_test("test_gcpio_compat_ref_nosym.crc",
		    "--no-preserve-owner", "2 blocks\n");
		unpack_test("test_gcpio_compat_ref_nosym.newc",
		    "--no-preserve-owner", "2 blocks\n");
		/* gcpio-2.9 only reads 6 blocks here */
		unpack_test("test_gcpio_compat_ref_nosym.ustar",
		    "--no-preserve-owner", "7 blocks\n");
	}
}